

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

void print_usage(char *executable)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Usage:\n\t");
  poVar1 = std::operator<<(poVar1,executable);
  poVar1 = std::operator<<(poVar1," (--system|--user|--both) [--verbose] [--dry-run]");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void print_usage(const char *executable)
{
    std::cout << "Usage:\n\t" << executable << " (--system|--user|--both) [--verbose] [--dry-run]" << std::endl;
}